

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_graphics_pipelines(StateRecorder *recorder)

{
  bool bVar1;
  VkPipeline_T *pVVar2;
  undefined4 local_618 [2];
  VkRenderingInputAttachmentIndexInfoKHR input_attachment_info;
  uint32_t uStack_5e0;
  uint32_t color_locs [3];
  VkRenderingAttachmentLocationInfoKHR attachment_location_info;
  undefined8 local_5b0;
  VkDepthClampRangeEXT range;
  VkPipelineViewportDepthClampControlCreateInfoEXT clamp_control;
  VkDepthBiasRepresentationInfoEXT depth_bias_representation_info;
  VkPipelineRobustnessCreateInfoEXT robustness_info;
  VkPipelineViewportDepthClipControlCreateInfoEXT clip_control;
  VkSampleLocationEXT locations [2];
  undefined4 local_518 [2];
  VkPipelineSampleLocationsStateCreateInfoEXT sample_location;
  VkPipelineFragmentShadingRateStateCreateInfoKHR fragment_shading_rate;
  VkRect2D discard_rectangles [1];
  undefined4 local_4a0 [2];
  VkPipelineDiscardRectangleStateCreateInfoEXT discard_rectangle;
  Hash hash [2];
  VkPipelineCreationFeedbackCreateInfoEXT feedback;
  VkPipelineRasterizationProvokingVertexStateCreateInfoEXT provoking_vertex;
  undefined8 uStack_420;
  VkBool32 color_write_enables [1];
  VkPipelineColorWriteCreateInfoEXT color_write;
  VkPipelineRasterizationLineStateCreateInfoEXT line_state;
  VkPipelineRasterizationConservativeStateCreateInfoEXT conservative_state;
  VkPipelineRasterizationStateStreamCreateInfoEXT stream_state;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT clip_state;
  VkPipelineTessellationDomainOriginStateCreateInfo domain;
  VkPipelineColorBlendAdvancedStateCreateInfoEXT advanced;
  VkVertexInputBindingDivisorDescriptionEXT divisor_descs [2];
  VkPipelineVertexInputDivisorStateCreateInfoEXT divisor2;
  VkPipelineVertexInputDivisorStateCreateInfoEXT divisor;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineRasterizationStateCreateInfo rs;
  VkPipelineDepthStencilStateCreateInfo ds;
  VkPipelineTessellationStateCreateInfo tess;
  VkPipelineColorBlendStateCreateInfo blend;
  VkPipelineViewportStateCreateInfo vp;
  VkPipelineDynamicStateCreateInfo dyn;
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineVertexInputStateCreateInfo vi;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT required_size;
  VkPipelineShaderStageCreateInfo stages [2];
  undefined1 local_c0 [8];
  VkGraphicsPipelineCreateInfo pipe;
  VkSpecializationInfo spec;
  StateRecorder *recorder_local;
  
  memset(&pipe.basePipelineIndex,0,0x20);
  pipe.basePipelineIndex = 2;
  memset(local_c0,0,0x90);
  local_c0._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipe.pDynamicState = (VkPipelineDynamicStateCreateInfo *)fake_handle<VkPipelineLayout_T*>(0x2712);
  pipe.renderPass._0_4_ = 1;
  pipe.layout = (VkPipelineLayout)fake_handle<VkRenderPass_T*>(0x7531);
  pipe.pNext._4_4_ = 2;
  memset(&required_size.requiredSubgroupSize,0,0x60);
  required_size.requiredSubgroupSize = 0x12;
  fake_handle<VkShaderModule_T*>(5000);
  fake_handle<VkShaderModule_T*>(0x1389);
  required_size.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  required_size._4_4_ = 0;
  required_size.pNext = (void *)0x10;
  pipe._16_8_ = &required_size.requiredSubgroupSize;
  memset(&ms.alphaToCoverageEnable,0,0x30);
  ms.alphaToCoverageEnable = 0x13;
  memset(&dyn.pDynamicStates,0,0x30);
  dyn.pDynamicStates._0_4_ = 0x18;
  vp.pScissors = (VkRect2D *)0x1b;
  dyn.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  dyn._4_4_ = 0;
  dyn.pNext = (void *)0x0;
  dyn.flags = 0;
  dyn.dynamicStateCount = 0;
  memset(blend.blendConstants + 2,0,0x30);
  blend.blendConstants[2] = 3.08286e-44;
  memset(&tess.flags,0,0x38);
  tess.flags = 0x1a;
  ds.minDepthBounds = 2.94273e-44;
  ds.maxDepthBounds = 0.0;
  tess.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  tess._4_4_ = 0;
  tess.pNext = (void *)0x0;
  memset(&rs.lineWidth,0,0x68);
  rs.lineWidth = 3.50325e-44;
  memset(&ia.primitiveRestartEnable,0,0x40);
  ia.primitiveRestartEnable = 0x17;
  divisor.pVertexBindingDivisors = (VkVertexInputBindingDivisorDescription *)0x14;
  ia.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ia._4_4_ = 0;
  ia.pNext = (void *)0x0;
  ia.flags = 0;
  ia.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  divisor.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  divisor._4_4_ = 0;
  divisor.vertexBindingDivisorCount = 0;
  divisor._20_4_ = 0;
  divisor_descs[1].binding = 0x3b9db031;
  divisor_descs[1].divisor = 0;
  divisor.pNext = (void *)0x2;
  memset(&advanced.blendOverlap,0,0x10);
  advanced.blendOverlap = VK_BLEND_OVERLAP_UNCORRELATED_EXT;
  advanced._28_4_ = 1;
  divisor_descs[0].binding = 1;
  divisor_descs[0].divisor = 4;
  divisor._16_8_ = &advanced.blendOverlap;
  divisor._0_8_ = divisor_descs + 1;
  domain.domainOrigin = 0x3b9d0c22;
  domain._20_4_ = 0;
  advanced.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  advanced._4_4_ = 0;
  advanced.srcPremultiplied = 2;
  advanced.dstPremultiplied = 0;
  advanced.pNext = (void *)0x100000001;
  blend._0_8_ = &domain.domainOrigin;
  ms.pNext._4_4_ = 0x10;
  ms.flags = 1;
  ms.rasterizationSamples = 0x3f000000;
  ms.pSampleMask._0_4_ = 1;
  ms.pSampleMask._4_4_ = 1;
  ms._24_8_ = &record_graphics_pipelines::mask;
  dyn.pNext = (void *)CONCAT44(3,dyn.pNext._0_4_);
  dyn._16_8_ = record_graphics_pipelines::dyn_states;
  vp.pNext._4_4_ = 2;
  vp.pViewports._0_4_ = 2;
  vp._16_8_ = record_graphics_pipelines::vps;
  vp._32_8_ = record_graphics_pipelines::sci;
  blend.pNext._4_4_ = 1;
  blend.flags = 4;
  blend.pAttachments._0_4_ = 0x41100000;
  blend.pAttachments._4_4_ = 0x41980000;
  blend.blendConstants[0] = 29.0;
  blend.blendConstants[1] = 39.0;
  blend.logicOpEnable = 2;
  blend._24_8_ = record_graphics_pipelines::blend_attachments;
  tess.pNext = (void *)CONCAT44(9,tess.pNext._0_4_);
  clip_state.flags = 0x3b9c930b;
  clip_state.depthClipEnable = 0;
  domain.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  domain._4_4_ = 0;
  domain.pNext = (void *)0x1;
  tess._0_8_ = &clip_state.flags;
  ds.front.passOp = VK_STENCIL_OP_DECREMENT_AND_CLAMP;
  ds.front.compareOp = 9;
  ds.front.compareMask = 10;
  ds.depthBoundsTestEnable = 3;
  ds.front.failOp = VK_STENCIL_OP_INVERT;
  ds.front.depthFailOp = 0x13;
  ds.stencilTestEnable = 2;
  ds.back.passOp = VK_STENCIL_OP_ZERO;
  ds.back.compareOp = 0x4f;
  ds.back.compareMask = 0x50;
  ds.front.writeMask = 6;
  ds.back.failOp = VK_STENCIL_OP_ZERO;
  ds.back.depthFailOp = 0x1d;
  ds.front.reference = 3;
  ds.depthCompareOp = VK_COMPARE_OP_LESS;
  ds.back.writeMask = 0x3dcccccd;
  ds.back.reference = 0x3e4ccccd;
  ds.depthTestEnable = 2;
  ds.flags = 1;
  ds.pNext._4_4_ = 1;
  ds.depthWriteEnable = 1;
  rs.polygonMode = VK_POLYGON_MODE_LINE;
  rs.depthClampEnable = 1;
  rs.pNext._4_4_ = 1;
  rs.cullMode = 1;
  rs.depthBiasConstantFactor = 0.3;
  rs.frontFace = 0x3f4ccccd;
  rs.depthBiasEnable = 0x3f000000;
  rs.flags = 0;
  rs.depthBiasClamp = 0.1;
  rs.rasterizerDiscardEnable = 3;
  stream_state.flags = 0x3b9c5871;
  stream_state.rasterizationStream = 0;
  clip_state.pNext = (void *)0x100000000;
  rs._0_8_ = &stream_state.flags;
  conservative_state.extraPrimitiveOverestimationSize = 0.0047368268;
  conservative_state._28_4_ = 0;
  stream_state.pNext = (void *)0x100000000;
  clip_state._0_8_ = &conservative_state.extraPrimitiveOverestimationSize;
  line_state.lineStippleFactor = 0x3b9c5489;
  line_state.lineStipplePattern = 0;
  line_state._30_2_ = 0;
  conservative_state.flags = 0x40200000;
  conservative_state.conservativeRasterizationMode = VK_CONSERVATIVE_RASTERIZATION_MODE_DISABLED_EXT
  ;
  conservative_state.pNext = (void *)0x100000000;
  stream_state._0_8_ = &line_state.lineStippleFactor;
  color_write.pColorWriteEnables = (VkBool32 *)0x3b9ebdb9;
  line_state.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  line_state._4_4_ = 0;
  line_state.lineRasterizationMode = VK_LINE_RASTERIZATION_MODE_BRESENHAM;
  line_state.stippledLineEnable = 3;
  line_state.pNext = (void *)0x100000002;
  conservative_state._0_8_ = &color_write.pColorWriteEnables;
  ia.pNext = (void *)CONCAT44(2,ia.pNext._0_4_);
  ia.flags = 1;
  uStack_420 = 0x3ba09a49;
  color_write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  color_write._4_4_ = 0;
  color_write.pNext = (void *)0x0;
  color_write.attachmentCount = 0;
  color_write._20_4_ = 0;
  memset(&provoking_vertex.field_0x14,0,4);
  provoking_vertex._20_4_ = 1;
  color_write.pNext = (void *)CONCAT44(color_write.pNext._4_4_,1);
  color_write._16_8_ = &provoking_vertex.field_0x14;
  advanced._0_8_ = &stack0xfffffffffffffbe0;
  feedback.pPipelineStageCreationFeedbacks = (VkPipelineCreationFeedback *)0x3b9eaa31;
  provoking_vertex.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  provoking_vertex._4_4_ = 0;
  provoking_vertex.pNext = (void *)0x0;
  line_state._0_8_ = &feedback.pPipelineStageCreationFeedbacks;
  pipe.pStages = (VkPipelineShaderStageCreateInfo *)&ms.alphaToCoverageEnable;
  pipe.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)&dyn.pDynamicStates;
  pipe.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)&vp.pScissors;
  pipe.pTessellationState = (VkPipelineTessellationStateCreateInfo *)(blend.blendConstants + 2);
  pipe.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)&tess.flags;
  pipe.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)&ds.minDepthBounds;
  pipe.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)&rs.lineWidth;
  pipe.pViewportState = (VkPipelineViewportStateCreateInfo *)&ia.primitiveRestartEnable;
  pipe.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)&divisor.pVertexBindingDivisors;
  pVVar2 = fake_handle<VkPipeline_T*>(100000);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  vp.pNext._4_4_ = 0;
  vp.pViewports._0_4_ = 0;
  pipe._120_8_ = fake_handle<VkPipeline_T*>(100000);
  pipe.basePipelineHandle._0_4_ = 200;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  memset(hash + 1,0,0x28);
  hash[1]._0_4_ = 0x3b9db800;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)local_c0,
                     (Hash *)&discard_rectangle.pDiscardRectangles);
  if (!bVar1) {
    abort();
  }
  pipe._0_8_ = hash + 1;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (recorder,(VkGraphicsPipelineCreateInfo *)local_c0,hash);
  if (!bVar1) {
    abort();
  }
  if (discard_rectangle.pDiscardRectangles != (VkRect2D *)hash[0]) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a2);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  memset(local_4a0,0,0x28);
  local_4a0[0] = 0x3b9c4cb9;
  memset(fragment_shading_rate.combinerOps,0,0x10);
  fragment_shading_rate.combinerOps[0] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
  fragment_shading_rate.combinerOps[1] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
  discard_rectangle.pNext._0_4_ = 0;
  discard_rectangle.pNext._4_4_ = 1;
  discard_rectangle.flags = 1;
  discard_rectangle._24_8_ = fragment_shading_rate.combinerOps;
  pipe._0_8_ = local_4a0;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a3);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  sample_location.sampleLocationsInfo.pSampleLocations = (VkSampleLocationEXT *)0x3b9e3cd1;
  fragment_shading_rate.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  fragment_shading_rate._4_4_ = 0;
  fragment_shading_rate.pNext = (void *)0x200000002;
  fragment_shading_rate.fragmentSize.width = 1;
  fragment_shading_rate.fragmentSize.height = 0;
  pipe._0_8_ = &sample_location.sampleLocationsInfo.pSampleLocations;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a4);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  memset(local_518,0,0x40);
  local_518[0] = 0x3b9cf89a;
  sample_location.sampleLocationsEnable = 0x3b9cf898;
  sample_location.sampleLocationsInfo._12_8_ = 0x300000002;
  sample_location.sampleLocationsInfo.pNext._0_4_ = 2;
  sample_location.sampleLocationsInfo.sampleLocationGridSize.width = 2;
  clip_control.negativeOneToOne = 0x3e000000;
  clip_control._20_4_ = 0x3f000000;
  sample_location.sampleLocationsInfo._24_8_ = &clip_control.negativeOneToOne;
  ms._0_8_ = local_518;
  pipe.subpass = 0;
  pipe._124_4_ = 0;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a5);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  sample_location.pNext._0_4_ = 1;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a6);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  robustness_info.vertexInputs = 0x3ba034b9;
  robustness_info.images = VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DEVICE_DEFAULT;
  clip_control.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  clip_control._4_4_ = 0;
  clip_control.pNext = (void *)0x0;
  vp._0_8_ = &robustness_info.vertexInputs;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a7);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  clip_control.pNext = (void *)CONCAT44(clip_control.pNext._4_4_,1);
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a8);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  depth_bias_representation_info.depthBiasRepresentation = 0x3b9bd3a0;
  depth_bias_representation_info.depthBiasExact = 0;
  robustness_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  robustness_info._4_4_ = 0;
  robustness_info.pNext = (void *)0x200000001;
  robustness_info.storageBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2;
  robustness_info.uniformBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2;
  pipe._0_8_ = &depth_bias_representation_info.depthBiasRepresentation;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186a9);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  robustness_info.uniformBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DISABLED;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186aa);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  clamp_control.pDepthClampRange = (VkDepthClampRangeEXT *)0x3b9f1b7a;
  depth_bias_representation_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depth_bias_representation_info._4_4_ = 0;
  depth_bias_representation_info.pNext = (void *)0x100000001;
  rs._0_8_ = &clamp_control.pDepthClampRange;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186ab);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  range.minDepthClamp = 0.0049948026;
  range.maxDepthClamp = 0.0;
  clamp_control.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  clamp_control._4_4_ = 0;
  clamp_control.depthClampMode = VK_DEPTH_CLAMP_MODE_VIEWPORT_RANGE_EXT;
  clamp_control._20_4_ = 0;
  vp._0_8_ = &range;
  clamp_control.pNext = (void *)0x0;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186ac);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  clamp_control.pNext = (void *)CONCAT44(clamp_control.pNext._4_4_,1);
  local_5b0 = 0x3f4ccccd3f000000;
  clamp_control._16_8_ = &local_5b0;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186ad);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  local_5b0 = 0x3e4ccccd3f4ccccd;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186ae);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  color_locs[1] = 0x3b9e5441;
  color_locs[2] = 0;
  pipe._0_8_ = color_locs + 1;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186af);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b0);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  stack0xfffffffffffffa1c = 0x400000005;
  color_locs[0] = 0xffffffff;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b1);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  memset(local_618,0,0x30);
  local_618[0] = 0x3b9e5442;
  input_attachment_info.pNext._0_4_ = 2;
  pipe._0_8_ = local_618;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b2);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  input_attachment_info._16_8_ = (long)&input_attachment_info.pStencilInputAttachmentIndex + 4;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b3);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  input_attachment_info.pColorAttachmentInputIndices = &uStack_5e0;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b4);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  input_attachment_info.pDepthInputAttachmentIndex = color_locs;
  pVVar2 = fake_handle<VkPipeline_T*>(0x186b5);
  bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,pVVar2,(VkGraphicsPipelineCreateInfo *)local_c0,(VkPipeline *)0x0,0,0,
                     (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (!bVar1) {
    abort();
  }
  return;
}

Assistant:

static void record_graphics_pipelines(StateRecorder &recorder)
{
	VkSpecializationInfo spec = {};
	spec.dataSize = 16;
	static const float data[4] = { 1.0f, 2.0f, 3.0f, 4.0f };
	spec.pData = data;
	spec.mapEntryCount = 2;
	static const VkSpecializationMapEntry entries[2] = {
		{ 0, 4, 8 },
		{ 4, 4, 16 },
	};
	spec.pMapEntries = entries;

	VkGraphicsPipelineCreateInfo pipe = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	pipe.layout = fake_handle<VkPipelineLayout>(10002);
	pipe.subpass = 1;
	pipe.renderPass = fake_handle<VkRenderPass>(30001);
	pipe.stageCount = 2;

	VkPipelineShaderStageCreateInfo stages[2] = {};
	stages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	stages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
	stages[0].pName = "vert";
	stages[0].module = fake_handle<VkShaderModule>(5000);
	stages[0].pSpecializationInfo = &spec;
	stages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	stages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
	stages[1].pName = "frag";
	stages[1].module = fake_handle<VkShaderModule>(5001);
	stages[1].pSpecializationInfo = &spec;

	VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT required_size =
			{ VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT };
	required_size.requiredSubgroupSize = 16;
	stages[1].pNext = &required_size;

	pipe.pStages = stages;

	VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
	VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
	VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
	VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
	VkPipelineColorBlendStateCreateInfo blend = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
	VkPipelineTessellationStateCreateInfo tess = { VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO };
	VkPipelineDepthStencilStateCreateInfo ds = { VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO };
	VkPipelineRasterizationStateCreateInfo rs = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
	VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };

	VkPipelineVertexInputDivisorStateCreateInfoEXT divisor = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT };
	VkPipelineVertexInputDivisorStateCreateInfoEXT divisor2 = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT };
	divisor.vertexBindingDivisorCount = 2;
	divisor2.vertexBindingDivisorCount = 1;

	VkVertexInputBindingDivisorDescriptionEXT divisor_descs[2] = {};
	divisor_descs[0].binding = 0;
	divisor_descs[0].divisor = 1;
	divisor_descs[1].binding = 1;
	divisor_descs[1].divisor = 4;
	divisor.pVertexBindingDivisors = divisor_descs;
	divisor2.pVertexBindingDivisors = divisor_descs;
	vi.pNext = &divisor;
	divisor.pNext = &divisor2;

	VkPipelineColorBlendAdvancedStateCreateInfoEXT advanced = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT };
	advanced.blendOverlap = VK_BLEND_OVERLAP_CONJOINT_EXT;
	advanced.srcPremultiplied = VK_TRUE;
	advanced.dstPremultiplied = VK_TRUE;
	blend.pNext = &advanced;

	static const VkVertexInputAttributeDescription attrs[2] = {
		{ 2, 1, VK_FORMAT_R16G16_SFLOAT, 5 },
		{ 9, 1, VK_FORMAT_R8_UINT, 5 },
	};
	static const VkVertexInputBindingDescription binds[2] = {
		{ 8, 1, VK_VERTEX_INPUT_RATE_INSTANCE },
		{ 9, 6, VK_VERTEX_INPUT_RATE_VERTEX },
	};
	vi.vertexBindingDescriptionCount = 2;
	vi.vertexAttributeDescriptionCount = 2;
	vi.pVertexBindingDescriptions = binds;
	vi.pVertexAttributeDescriptions = attrs;

	ms.rasterizationSamples = VK_SAMPLE_COUNT_16_BIT;
	ms.sampleShadingEnable = VK_TRUE;
	ms.minSampleShading = 0.5f;
	ms.alphaToCoverageEnable = VK_TRUE;
	ms.alphaToOneEnable = VK_TRUE;
	static const uint32_t mask = 0xf;
	ms.pSampleMask = &mask;

	static const VkDynamicState dyn_states[3] = {
			VK_DYNAMIC_STATE_BLEND_CONSTANTS,
			VK_DYNAMIC_STATE_DEPTH_BIAS,
			VK_DYNAMIC_STATE_LINE_WIDTH
	};
	dyn.dynamicStateCount = 3;
	dyn.pDynamicStates = dyn_states;

	static const VkViewport vps[2] = {
		{ 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 6.0f },
		{ 11.0f, 12.0f, 13.0f, 14.0f, 15.0f, 16.0f },
	};
	static const VkRect2D sci[2] = {
		{ { 3, 4 }, { 8, 9 }},
		{ { 13, 14 }, { 18, 19 }},
	};
	vp.viewportCount = 2;
	vp.scissorCount = 2;
	vp.pViewports = vps;
	vp.pScissors = sci;

	static const VkPipelineColorBlendAttachmentState blend_attachments[2] = {
			{ VK_TRUE,
					VK_BLEND_FACTOR_DST_ALPHA, VK_BLEND_FACTOR_DST_ALPHA, VK_BLEND_OP_ADD,
					VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA, VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA, VK_BLEND_OP_SUBTRACT,
					0xf },
			{ VK_TRUE,
					VK_BLEND_FACTOR_SRC_ALPHA, VK_BLEND_FACTOR_SRC_ALPHA, VK_BLEND_OP_ADD,
					VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA, VK_BLEND_FACTOR_ONE_MINUS_SRC1_ALPHA, VK_BLEND_OP_SUBTRACT,
					0x3 },
	};
	blend.logicOpEnable = VK_TRUE;
	blend.logicOp = VK_LOGIC_OP_AND_INVERTED;
	blend.blendConstants[0] = 9.0f;
	blend.blendConstants[1] = 19.0f;
	blend.blendConstants[2] = 29.0f;
	blend.blendConstants[3] = 39.0f;
	blend.attachmentCount = 2;
	blend.pAttachments = blend_attachments;

	tess.patchControlPoints = 9;
	VkPipelineTessellationDomainOriginStateCreateInfo domain =
			{ VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO };
	domain.domainOrigin = VK_TESSELLATION_DOMAIN_ORIGIN_LOWER_LEFT;
	tess.pNext = &domain;

	ds.front.compareOp = VK_COMPARE_OP_GREATER;
	ds.front.writeMask = 9;
	ds.front.reference = 10;
	ds.front.failOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
	ds.front.depthFailOp = VK_STENCIL_OP_INVERT;
	ds.front.compareMask = 19;
	ds.front.passOp = VK_STENCIL_OP_REPLACE;
	ds.back.compareOp = VK_COMPARE_OP_LESS;
	ds.back.writeMask = 79;
	ds.back.reference = 80;
	ds.back.failOp = VK_STENCIL_OP_INCREMENT_AND_WRAP;
	ds.back.depthFailOp = VK_STENCIL_OP_ZERO;
	ds.back.compareMask = 29;
	ds.back.passOp = VK_STENCIL_OP_INCREMENT_AND_CLAMP;
	ds.stencilTestEnable = VK_TRUE;
	ds.minDepthBounds = 0.1f;
	ds.maxDepthBounds = 0.2f;
	ds.depthCompareOp = VK_COMPARE_OP_EQUAL;
	ds.depthWriteEnable = VK_TRUE;
	ds.depthTestEnable = VK_TRUE;
	ds.depthBoundsTestEnable = VK_TRUE;

	rs.frontFace = VK_FRONT_FACE_CLOCKWISE;
	rs.polygonMode = VK_POLYGON_MODE_LINE;
	rs.depthClampEnable = VK_TRUE;
	rs.depthBiasEnable = VK_TRUE;
	rs.depthBiasSlopeFactor = 0.3f;
	rs.depthBiasConstantFactor = 0.8f;
	rs.depthBiasClamp = 0.5f;
	rs.rasterizerDiscardEnable = VK_FALSE;
	rs.lineWidth = 0.1f;
	rs.cullMode = VK_CULL_MODE_FRONT_AND_BACK;

	VkPipelineRasterizationDepthClipStateCreateInfoEXT clip_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT };
	clip_state.depthClipEnable = VK_TRUE;
	rs.pNext = &clip_state;

	VkPipelineRasterizationStateStreamCreateInfoEXT stream_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT };
	stream_state.rasterizationStream = VK_TRUE;
	clip_state.pNext = &stream_state;

	VkPipelineRasterizationConservativeStateCreateInfoEXT conservative_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT };
	conservative_state.flags = 0;
	conservative_state.extraPrimitiveOverestimationSize = 2.5f;
	conservative_state.conservativeRasterizationMode = VK_CONSERVATIVE_RASTERIZATION_MODE_OVERESTIMATE_EXT;
	stream_state.pNext = &conservative_state;

	VkPipelineRasterizationLineStateCreateInfoEXT line_state =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_EXT };
	line_state.lineRasterizationMode = VK_LINE_RASTERIZATION_MODE_BRESENHAM_EXT;
	line_state.lineStippleFactor = 2;
	line_state.lineStipplePattern = 3;
	line_state.stippledLineEnable = VK_TRUE;
	conservative_state.pNext = &line_state;

	ia.topology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
	ia.primitiveRestartEnable = VK_TRUE;

	VkPipelineColorWriteCreateInfoEXT color_write =
			{ VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT };
	VkBool32 color_write_enables[1] = { };
	color_write_enables[0] = VK_TRUE;
	color_write.attachmentCount = 1;
	color_write.pColorWriteEnables = color_write_enables;
	advanced.pNext = &color_write;

	VkPipelineRasterizationProvokingVertexStateCreateInfoEXT provoking_vertex =
			{ VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT };
	provoking_vertex.provokingVertexMode = VK_PROVOKING_VERTEX_MODE_FIRST_VERTEX_EXT;
	line_state.pNext = &provoking_vertex;

	pipe.pVertexInputState = &vi;
	pipe.pMultisampleState = &ms;
	pipe.pDynamicState = &dyn;
	pipe.pViewportState = &vp;
	pipe.pColorBlendState = &blend;
	pipe.pTessellationState = &tess;
	pipe.pDepthStencilState = &ds;
	pipe.pRasterizationState = &rs;
	pipe.pInputAssemblyState = &ia;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100000), pipe, nullptr, 0))
		abort();

	vp.viewportCount = 0;
	vp.scissorCount = 0;
	pipe.basePipelineHandle = fake_handle<VkPipeline>(100000);
	pipe.basePipelineIndex = 200;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100001), pipe, nullptr, 0))
		abort();

	VkPipelineCreationFeedbackCreateInfoEXT feedback = { VK_STRUCTURE_TYPE_PIPELINE_CREATION_FEEDBACK_CREATE_INFO_EXT };

	Hash hash[2];
	if (!Hashing::compute_hash_graphics_pipeline(recorder, pipe, &hash[0]))
		abort();
	pipe.pNext = &feedback;
	if (!Hashing::compute_hash_graphics_pipeline(recorder, pipe, &hash[1]))
		abort();

	if (hash[0] != hash[1])
		abort();

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100002), pipe, nullptr, 0))
		abort();

	VkPipelineDiscardRectangleStateCreateInfoEXT discard_rectangle =
			{ VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT };
	VkRect2D discard_rectangles[1] = {};
	discard_rectangles[0].offset.x = 0;
	discard_rectangles[0].offset.y = 0;
	discard_rectangles[0].extent.width = 32;
	discard_rectangles[0].extent.height = 32;
	discard_rectangle.flags = 0;
	discard_rectangle.discardRectangleMode = VK_DISCARD_RECTANGLE_MODE_EXCLUSIVE_EXT;
	discard_rectangle.discardRectangleCount = 1;
	discard_rectangle.pDiscardRectangles = discard_rectangles;
	pipe.pNext = &discard_rectangle;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100003), pipe, nullptr, 0))
		abort();

	VkPipelineFragmentShadingRateStateCreateInfoKHR fragment_shading_rate =
			{ VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR };
	fragment_shading_rate.fragmentSize.width = 2;
	fragment_shading_rate.fragmentSize.height = 2;
	fragment_shading_rate.combinerOps[0] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_REPLACE_KHR;
	fragment_shading_rate.combinerOps[1] = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
	pipe.pNext = &fragment_shading_rate;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100004), pipe, nullptr, 0))
		abort();

	VkPipelineSampleLocationsStateCreateInfoEXT sample_location = { VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT };
	sample_location.sampleLocationsInfo.sType = VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT;
	sample_location.sampleLocationsInfo.sampleLocationGridSize = { 2, 3 };
	sample_location.sampleLocationsInfo.sampleLocationsPerPixel = VK_SAMPLE_COUNT_2_BIT;
	sample_location.sampleLocationsInfo.sampleLocationsCount = 2;
	const VkSampleLocationEXT locations[2] = {{ 0.125f, 0.5f }, { -0.25f, 0.25f }};
	sample_location.sampleLocationsInfo.pSampleLocations = locations;
	ms.pNext = &sample_location;
	pipe.basePipelineHandle = VK_NULL_HANDLE;

	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100005), pipe, nullptr, 0))
		abort();
	sample_location.sampleLocationsEnable = VK_TRUE;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100006), pipe, nullptr, 0))
		abort();

	VkPipelineViewportDepthClipControlCreateInfoEXT clip_control = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT };
	clip_control.negativeOneToOne = VK_FALSE;
	vp.pNext = &clip_control;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100007), pipe, nullptr, 0))
		abort();
	clip_control.negativeOneToOne = VK_TRUE;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100008), pipe, nullptr, 0))
		abort();

	VkPipelineRobustnessCreateInfoEXT robustness_info = { VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT };
	robustness_info.vertexInputs = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;
	robustness_info.uniformBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_EXT;
	robustness_info.storageBuffers = VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DISABLED_EXT;
	robustness_info.images = VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
	pipe.pNext = &robustness_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100009), pipe, nullptr, 0))
		abort();
	robustness_info.images = VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DISABLED_EXT;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100010), pipe, nullptr, 0))
		abort();

	VkDepthBiasRepresentationInfoEXT depth_bias_representation_info =
			{ VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT };
	depth_bias_representation_info.depthBiasRepresentation =
			VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT;
	depth_bias_representation_info.depthBiasExact = VK_TRUE;
	rs.pNext = &depth_bias_representation_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100011), pipe, nullptr, 0))
		abort();

	VkPipelineViewportDepthClampControlCreateInfoEXT clamp_control = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT };
	vp.pNext = &clamp_control;
	clamp_control.depthClampMode = VK_DEPTH_CLAMP_MODE_VIEWPORT_RANGE_EXT;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100012), pipe, nullptr, 0))
		abort();
	clamp_control.depthClampMode = VK_DEPTH_CLAMP_MODE_USER_DEFINED_RANGE_EXT;
	VkDepthClampRangeEXT range = { 0.5f, 0.8f };
	clamp_control.pDepthClampRange = &range;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100013), pipe, nullptr, 0))
		abort();
	range = { 0.8f, 0.2f };
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100014), pipe, nullptr, 0))
		abort();

	VkRenderingAttachmentLocationInfoKHR attachment_location_info = { VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR };
	pipe.pNext = &attachment_location_info;
	attachment_location_info.colorAttachmentCount = 1;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100015), pipe, nullptr, 0))
		abort();
	attachment_location_info.colorAttachmentCount = 2;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100016), pipe, nullptr, 0))
		abort();

	const uint32_t color_locs[] = { 5, 4, UINT32_MAX };
	attachment_location_info.pColorAttachmentLocations = color_locs;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100017), pipe, nullptr, 0))
		abort();

	VkRenderingInputAttachmentIndexInfoKHR input_attachment_info = { VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR };
	input_attachment_info.colorAttachmentCount = 2;
	pipe.pNext = &input_attachment_info;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100018), pipe, nullptr, 0))
		abort();
	input_attachment_info.pColorAttachmentInputIndices = color_locs;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100019), pipe, nullptr, 0))
		abort();
	input_attachment_info.pDepthInputAttachmentIndex = color_locs + 1;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100020), pipe, nullptr, 0))
		abort();
	input_attachment_info.pStencilInputAttachmentIndex = color_locs + 2;
	if (!recorder.record_graphics_pipeline(fake_handle<VkPipeline>(100021), pipe, nullptr, 0))
		abort();
}